

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_multiplyv3(quaternion *self,vector3 *vT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = (self->field_0).q[3];
  fVar2 = (self->field_0).q[0];
  fVar3 = (self->field_0).q[1];
  fVar4 = (vT->field_0).v[2];
  fVar5 = (vT->field_0).v[0];
  fVar6 = (vT->field_0).v[1];
  fVar7 = (self->field_0).q[2];
  (self->field_0).q[0] = (fVar1 * fVar5 + fVar3 * fVar4) - fVar7 * fVar6;
  (self->field_0).q[1] = fVar7 * fVar5 + (fVar1 * fVar6 - fVar4 * fVar2);
  (self->field_0).q[2] = (fVar1 * fVar4 + fVar6 * fVar2) - fVar3 * fVar5;
  (self->field_0).q[3] = (fVar2 * fVar5 - fVar6 * fVar3) - fVar7 * fVar4;
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiplyv3(struct quaternion *self, const struct vector3 *vT)
{
	/* vT is the multiplicand */

	struct quaternion r;

	r.x = self->w * vT->x + self->y * vT->z - self->z * vT->y;
	r.y = self->w * vT->y - self->x * vT->z + self->z * vT->x;
	r.z = self->w * vT->z + self->x * vT->y - self->y * vT->x;
	r.w = self->x * vT->x - self->y * vT->y - self->z * vT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}